

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O2

bool slang::ast::isValidForUserDefinedNet(Type *type)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  long lVar6;
  
  while( true ) {
    pTVar4 = Type::getCanonicalType(type);
    bVar2 = Type::isIntegral(pTVar4);
    if (bVar2) {
      return true;
    }
    bVar2 = Type::isFloating(pTVar4);
    if (bVar2) {
      return true;
    }
    if ((pTVar4->super_Symbol).kind != FixedSizeUnpackedArrayType) break;
    type = *(Type **)&pTVar4[1].super_Symbol;
  }
  bVar2 = Type::isUnpackedStruct(pTVar4);
  if (bVar2) {
    pSVar1 = pTVar4[1].super_Symbol.originatingSyntax;
    pTVar4 = pTVar4[1].canonical;
    lVar6 = 0;
    do {
      bVar2 = (long)pTVar4 << 3 == lVar6;
      if (bVar2) {
        return bVar2;
      }
      pTVar5 = DeclaredType::getType
                         ((DeclaredType *)(*(long *)((long)&pSVar1->kind + lVar6) + 0x40));
      bVar3 = isValidForUserDefinedNet(pTVar5);
      lVar6 = lVar6 + 8;
    } while (bVar3);
    return bVar2;
  }
  bVar2 = Type::isUnpackedUnion(pTVar4);
  if (!bVar2) {
    return false;
  }
  pSVar1 = pTVar4[1].super_Symbol.originatingSyntax;
  pTVar4 = pTVar4[1].canonical;
  lVar6 = 0;
  do {
    bVar2 = (long)pTVar4 << 3 == lVar6;
    if (bVar2) {
      return bVar2;
    }
    pTVar5 = DeclaredType::getType((DeclaredType *)(*(long *)((long)&pSVar1->kind + lVar6) + 0x40));
    bVar3 = isValidForUserDefinedNet(pTVar5);
    lVar6 = lVar6 + 8;
  } while (bVar3);
  return bVar2;
}

Assistant:

static bool isValidForUserDefinedNet(const Type& type) {
    auto& ct = type.getCanonicalType();
    if (ct.isIntegral() || ct.isFloating())
        return true;

    if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType)
        return isValidForUserDefinedNet(ct.as<FixedSizeUnpackedArrayType>().elementType);

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!isValidForUserDefinedNet(field->getType()))
                return false;
        }
        return true;
    }

    if (ct.isUnpackedUnion()) {
        for (auto field : ct.as<UnpackedUnionType>().fields) {
            if (!isValidForUserDefinedNet(field->getType()))
                return false;
        }
        return true;
    }

    return false;
}